

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *node)

{
  long lVar1;
  long *plVar2;
  runtime_error *this_00;
  long *in_RDX;
  Transformer local_90;
  long *local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  
  lVar1 = *in_RDX;
  if (lVar1 != 0) {
    plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&NumericLiteral::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&Identifier::typeinfo,0);
      if (plVar2 == (long *)0x0) {
        plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&Cast::typeinfo,0);
        if (plVar2 == (long *)0x0) {
          plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&Attribute::typeinfo,0);
          if (plVar2 == (long *)0x0) {
            plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&String::typeinfo,0);
            if (plVar2 == (long *)0x0) {
              plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&Index::typeinfo,0);
              if (plVar2 == (long *)0x0) {
                plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&Slice::typeinfo,0);
                if (plVar2 == (long *)0x0) {
                  plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&BinaryOp::typeinfo,0)
                  ;
                  if (plVar2 == (long *)0x0) {
                    plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,&UnaryOp::typeinfo,0
                                                   );
                    if (plVar2 == (long *)0x0) {
                      plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,
                                                      &TernaryOp::typeinfo,0);
                      if (plVar2 == (long *)0x0) {
                        plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,
                                                        &Concat::typeinfo,0);
                        if (plVar2 == (long *)0x0) {
                          plVar2 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,
                                                          &Replicate::typeinfo,0);
                          if (plVar2 == (long *)0x0) {
                            local_88 = (long *)__dynamic_cast(lVar1,&Expression::typeinfo,
                                                              &CallExpr::typeinfo,0);
                            if (local_88 == (long *)0x0) goto LAB_0016667d;
                            *in_RDX = 0;
                            (*(code *)(node->_M_t).
                                      super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                                      .super__Head_base<0UL,_verilogAST::Expression_*,_false>.
                                      _M_head_impl[0xf].super_Node._vptr_Node)(&local_90,node);
                            this->_vptr_Transformer = (_func_int **)local_90;
                            plVar2 = local_88;
                          }
                          else {
                            *in_RDX = 0;
                            local_80 = plVar2;
                            (*(code *)(node->_M_t).
                                      super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                                      .super__Head_base<0UL,_verilogAST::Expression_*,_false>.
                                      _M_head_impl[0xc].super_Node._vptr_Node)(&local_90,node);
                            this->_vptr_Transformer = (_func_int **)local_90;
                            plVar2 = local_80;
                          }
                        }
                        else {
                          *in_RDX = 0;
                          local_78 = plVar2;
                          (*(code *)(node->_M_t).
                                    super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                                    .super__Head_base<0UL,_verilogAST::Expression_*,_false>.
                                    _M_head_impl[0xb].super_Node._vptr_Node)(&local_90,node);
                          this->_vptr_Transformer = (_func_int **)local_90;
                          plVar2 = local_78;
                        }
                      }
                      else {
                        *in_RDX = 0;
                        local_70 = plVar2;
                        (*(code *)(node->_M_t).
                                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>.
                                  _M_head_impl[10].super_Node._vptr_Node)(&local_90,node);
                        this->_vptr_Transformer = (_func_int **)local_90;
                        plVar2 = local_70;
                      }
                    }
                    else {
                      *in_RDX = 0;
                      local_68 = plVar2;
                      (*(code *)(node->_M_t).
                                super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                                .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl
                                [9].super_Node._vptr_Node)(&local_90,node);
                      this->_vptr_Transformer = (_func_int **)local_90;
                      plVar2 = local_68;
                    }
                  }
                  else {
                    *in_RDX = 0;
                    local_60 = plVar2;
                    (*(code *)(node->_M_t).
                              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl
                              [8].super_Node._vptr_Node)(&local_90,node);
                    this->_vptr_Transformer = (_func_int **)local_90;
                    plVar2 = local_60;
                  }
                }
                else {
                  *in_RDX = 0;
                  local_58 = plVar2;
                  (*(code *)(node->_M_t).
                            super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                            .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[7].
                            super_Node._vptr_Node)(&local_90,node);
                  this->_vptr_Transformer = (_func_int **)local_90;
                  plVar2 = local_58;
                }
              }
              else {
                *in_RDX = 0;
                local_50 = plVar2;
                (*(code *)(node->_M_t).
                          super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                          .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[6].
                          super_Node._vptr_Node)(&local_90,node);
                this->_vptr_Transformer = (_func_int **)local_90;
                plVar2 = local_50;
              }
            }
            else {
              *in_RDX = 0;
              local_48 = plVar2;
              (*(code *)(node->_M_t).
                        super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                        .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[5].
                        super_Node._vptr_Node)(&local_90,node);
              this->_vptr_Transformer = (_func_int **)local_90;
              plVar2 = local_48;
            }
          }
          else {
            *in_RDX = 0;
            local_40 = plVar2;
            (*(code *)(node->_M_t).
                      super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                      .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[4].
                      super_Node._vptr_Node)(&local_90,node);
            this->_vptr_Transformer = (_func_int **)local_90;
            plVar2 = local_40;
          }
        }
        else {
          *in_RDX = 0;
          local_38 = plVar2;
          (*(code *)(node->_M_t).
                    super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                    .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[3].
                    super_Node._vptr_Node)(&local_90,node);
          this->_vptr_Transformer = (_func_int **)local_90;
          plVar2 = local_38;
        }
      }
      else {
        *in_RDX = 0;
        local_30 = plVar2;
        (*(code *)(node->_M_t).
                  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                  .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[2].super_Node
                  ._vptr_Node)(&local_90,node);
        this->_vptr_Transformer = (_func_int **)local_90;
        plVar2 = local_30;
      }
    }
    else {
      *in_RDX = 0;
      local_28 = plVar2;
      (*(code *)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
                .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl[1].super_Node.
                _vptr_Node)(&local_90,node);
      this->_vptr_Transformer = (_func_int **)local_90;
      plVar2 = local_28;
    }
    local_90._vptr_Transformer = (_func_int **)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
    }
    return (__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
            )(__uniq_ptr_data<verilogAST::Expression,_std::default_delete<verilogAST::Expression>,_true,_true>
              )this;
  }
LAB_0016667d:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unreachable");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}